

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O2

uint64_t __thiscall foxxll::block_manager::free_bytes(block_manager *this)

{
  size_t i;
  size_t sVar1;
  uint64_t uVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->mutex_);
  uVar2 = 0;
  for (sVar1 = 0; this->ndisks_ != sVar1; sVar1 = sVar1 + 1) {
    uVar2 = uVar2 + (this->block_allocators_).array_[sVar1]->free_bytes_;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return uVar2;
}

Assistant:

uint64_t block_manager::free_bytes() const
{
    std::unique_lock<std::mutex> lock(mutex_);

    uint64_t total = 0;

    for (size_t i = 0; i < ndisks_; ++i)
        total += block_allocators_[i]->free_bytes();

    return total;
}